

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_private.hh
# Opt level: O0

void __thiscall QPDF::EncryptionParameters::EncryptionParameters(EncryptionParameters *this)

{
  EncryptionParameters *this_local;
  
  this->encrypted = false;
  this->encryption_initialized = false;
  this->encryption_V = 0;
  this->encryption_R = 0;
  this->encrypt_metadata = true;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF::encryption_method_e>_>_>
  ::map(&this->crypt_filters);
  this->cf_stream = e_none;
  this->cf_string = e_none;
  this->cf_file = e_none;
  std::__cxx11::string::string((string *)&this->provided_password);
  std::__cxx11::string::string((string *)&this->user_password);
  std::__cxx11::string::string((string *)&this->encryption_key);
  std::__cxx11::string::string((string *)&this->cached_object_encryption_key);
  memset(&this->cached_key_og,0,8);
  QPDFObjGen::QPDFObjGen(&this->cached_key_og);
  this->user_password_matched = false;
  this->owner_password_matched = false;
  return;
}

Assistant:

EncryptionParameters() = default;